

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::IsArgNegated(ArgsManager *this,string *strArg)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffff68;
  UniValue *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniValue *)&stack0xffffffffffffffa0;
  GetSetting((ArgsManager *)in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8);
  bVar2 = UniValue::isFalse(this_00);
  UniValue::~UniValue(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::IsArgNegated(const std::string& strArg) const
{
    return GetSetting(strArg).isFalse();
}